

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall
BoardView::DrawDiamond(BoardView *this,ImDrawList *draw,ImVec2 c,double r,uint32_t color)

{
  float fVar1;
  float fVar2;
  ImVec2 dia [4];
  ImVec2 local_28;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  float fStack_10;
  float fStack_c;
  
  fVar1 = c.x;
  fVar2 = c.y;
  local_28.y = (float)((double)fVar2 - r);
  local_28.x = fVar1;
  _fStack_20 = CONCAT44(fVar2,(float)((double)fVar1 + r));
  local_18 = CONCAT44((float)((double)fVar2 + r),fVar1);
  _fStack_10 = CONCAT44(fVar2,(float)((double)fVar1 - r));
  ImDrawList::AddPolyline(draw,&local_28,4,color,1,1.0);
  return;
}

Assistant:

void BoardView::DrawDiamond(ImDrawList *draw, ImVec2 c, double r, uint32_t color) {
	ImVec2 dia[4];

	dia[0] = ImVec2(c.x, c.y - r);
	dia[1] = ImVec2(c.x + r, c.y);
	dia[2] = ImVec2(c.x, c.y + r);
	dia[3] = ImVec2(c.x - r, c.y);

	draw->AddPolyline(dia, 4, color, true, 1.0f);
}